

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_write_format_mtree.c
# Opt level: O1

void test_write_format_mtree_sub2(int use_set,int dironly)

{
  uint uVar1;
  uint uVar2;
  long t;
  wchar_t wVar3;
  int iVar4;
  mode_t mVar5;
  mode_t mVar6;
  archive *paVar7;
  time_t tVar8;
  ulong uVar9;
  la_int64_t lVar10;
  longlong lVar11;
  char *v1;
  char *pcVar12;
  long lVar13;
  la_ssize_t v2;
  char *pcVar14;
  ulong uVar15;
  archive_entry *ae;
  size_t used;
  archive_entry *local_80;
  int local_74;
  archive *local_70;
  int local_64;
  size_t local_60;
  char local_58 [40];
  
  local_74 = dironly;
  paVar7 = archive_write_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_mtree.c"
                   ,L'¨',(uint)(paVar7 != (archive *)0x0),"(a = archive_write_new()) != NULL",
                   (void *)0x0);
  wVar3 = archive_write_set_format_mtree(paVar7);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_mtree.c"
                      ,L'©',0,"ARCHIVE_OK",(long)wVar3,"archive_write_set_format_mtree(a)",paVar7);
  local_64 = use_set;
  if (use_set != 0) {
    iVar4 = archive_write_set_format_option(paVar7,(char *)0x0,"use-set","1");
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_mtree.c"
                        ,L'«',0,"ARCHIVE_OK",(long)iVar4,
                        "archive_write_set_format_option(a, NULL, \"use-set\", \"1\")",paVar7);
  }
  if (local_74 != 0) {
    iVar4 = archive_write_set_format_option(paVar7,(char *)0x0,"dironly","1");
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_mtree.c"
                        ,L'­',0,"ARCHIVE_OK",(long)iVar4,
                        "archive_write_set_format_option(a, NULL, \"dironly\", \"1\")",paVar7);
  }
  iVar4 = archive_write_open_memory(paVar7,buff,0xfff,&local_60);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_mtree.c"
                      ,L'®',0,"ARCHIVE_OK",(long)iVar4,
                      "archive_write_open_memory(a, buff, sizeof(buff)-1, &used)",paVar7);
  pcVar12 = "COPYING";
  lVar13 = 0x20;
  local_70 = paVar7;
  do {
    local_80 = archive_entry_new();
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_mtree.c"
                     ,L'²',(uint)(local_80 != (archive_entry *)0x0),
                     "(ae = archive_entry_new()) != NULL",(void *)0x0);
    t = *(long *)((long)&entries[0xb].mtime + lVar13);
    archive_entry_set_mtime(local_80,t,0);
    tVar8 = archive_entry_mtime(local_80);
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_mtree.c"
                     ,L'´',(uint)(t == tVar8),"entries2[i].mtime == archive_entry_mtime(ae)",
                     (void *)0x0);
    mVar6 = *(mode_t *)((long)&entries[0xb].mode + lVar13);
    archive_entry_set_mode(local_80,mVar6);
    mVar5 = archive_entry_mode(local_80);
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_mtree.c"
                     ,L'¶',(uint)(mVar6 == mVar5),"entries2[i].mode == archive_entry_mode(ae)",
                     (void *)0x0);
    uVar15 = (ulong)*(uint *)((long)&entries[0xb].uid + lVar13);
    archive_entry_set_uid(local_80,uVar15);
    uVar9 = archive_entry_uid(local_80);
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_mtree.c"
                     ,L'¸',(uint)(uVar9 == uVar15),"entries2[i].uid == archive_entry_uid(ae)",
                     (void *)0x0);
    uVar15 = (ulong)*(uint *)((long)&entries[0xb].gid + lVar13);
    archive_entry_set_gid(local_80,uVar15);
    uVar9 = archive_entry_gid(local_80);
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_mtree.c"
                     ,L'º',(uint)(uVar9 == uVar15),"entries2[i].gid == archive_entry_gid(ae)",
                     (void *)0x0);
    archive_entry_copy_pathname(local_80,pcVar12);
    paVar7 = local_70;
    if ((mVar6 & 0xf000) == 0x4000) {
      iVar4 = archive_write_header(local_70,local_80);
      v2 = (la_ssize_t)iVar4;
      wVar3 = L'¾';
      lVar11 = 0;
      pcVar12 = "ARCHIVE_OK";
      pcVar14 = "archive_write_header(a, ae)";
    }
    else {
      archive_entry_set_size(local_80,8);
      paVar7 = local_70;
      iVar4 = archive_write_header(local_70,local_80);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_mtree.c"
                          ,L'¾',0,"ARCHIVE_OK",(long)iVar4,"archive_write_header(a, ae)",paVar7);
      v2 = archive_write_data(paVar7,"Hello012",0xf);
      lVar11 = 8;
      wVar3 = L'Á';
      pcVar12 = "8";
      pcVar14 = "archive_write_data(a, \"Hello012\", 15)";
    }
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_mtree.c"
                        ,wVar3,lVar11,pcVar12,v2,pcVar14,paVar7);
    archive_entry_free(local_80);
    pcVar12 = *(char **)((long)&entries2[0].path + lVar13);
    lVar13 = lVar13 + 0x20;
  } while (lVar13 != 0x180);
  iVar4 = archive_write_close(paVar7);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_mtree.c"
                      ,L'Ä',0,"ARCHIVE_OK",(long)iVar4,"archive_write_close(a)",paVar7);
  iVar4 = archive_write_free(paVar7);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_mtree.c"
                      ,L'Å',0,"ARCHIVE_OK",(long)iVar4,"archive_write_free(a)",(void *)0x0);
  if (local_64 != 0) {
    buff[local_60] = '\0';
    pcVar12 = strstr(buff,"\n/set ");
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_mtree.c"
                     ,L'Ë',(uint)(pcVar12 != (char *)0x0),
                     "NULL != (p = strstr(buff, \"\\n/set \"))",(void *)0x0);
    if (pcVar12 != (char *)0x0) {
      pcVar12 = pcVar12 + 1;
      pcVar14 = strchr(pcVar12,10);
      if (pcVar14 == (char *)0x0) {
        pcVar14 = "/set type=dir uid=1001 gid=1001 mode=755";
        if (local_74 == 0) {
          pcVar14 = "/set type=file uid=1001 gid=1001 mode=644";
        }
        assertion_equal_string
                  ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_mtree.c"
                   ,L'×',pcVar14,"o",pcVar12,"p",(void *)0x0,L'\0');
      }
      else {
        *pcVar14 = '\0';
        v1 = "/set type=dir uid=1001 gid=1001 mode=755";
        if (local_74 == 0) {
          v1 = "/set type=file uid=1001 gid=1001 mode=644";
        }
        assertion_equal_string
                  ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_mtree.c"
                   ,L'×',v1,"o",pcVar12,"p",(void *)0x0,L'\0');
        *pcVar14 = '\n';
      }
    }
  }
  paVar7 = archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_mtree.c"
                   ,L'à',(uint)(paVar7 != (archive *)0x0),"(a = archive_read_new()) != NULL",
                   (void *)0x0);
  iVar4 = archive_read_support_format_all(paVar7);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_mtree.c"
                      ,L'á',0,"ARCHIVE_OK",(long)iVar4,"archive_read_support_format_all(a)",paVar7)
  ;
  iVar4 = archive_read_support_filter_all(paVar7);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_mtree.c"
                      ,L'â',0,"ARCHIVE_OK",(long)iVar4,"archive_read_support_filter_all(a)",paVar7)
  ;
  iVar4 = archive_read_open_memory(paVar7,buff,local_60);
  local_70 = paVar7;
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_mtree.c"
                      ,L'ã',0,"ARCHIVE_OK",(long)iVar4,"archive_read_open_memory(a, buff, used)",
                      paVar7);
  local_58[3] = '\0';
  local_58[4] = '\0';
  local_58[5] = '\0';
  local_58[6] = '\0';
  local_58[7] = '\0';
  local_58[8] = '\0';
  local_58[9] = '\0';
  local_58[10] = '\0';
  local_58[0xb] = '\0';
  local_58[0xc] = '\0';
  local_58[0xd] = '\0';
  local_58[0xe] = '\0';
  local_58[0xf] = '\0';
  local_58[0x10] = '\0';
  local_58[0x11] = '\0';
  local_58[0x12] = '\0';
  local_58[0x13] = '\0';
  local_58[0x14] = '\0';
  local_58[0x15] = '\0';
  local_58[0x16] = '\0';
  local_58[0x17] = '\0';
  local_58[0x18] = '\0';
  local_58[0x19] = '\0';
  local_58[0x1a] = '\0';
  local_58[0x1b] = '\0';
  local_58[0x1c] = '\0';
  local_58[0x1d] = '\0';
  local_58[0x1e] = '\0';
  local_58[0x1f] = '\0';
  local_58[0] = '.';
  local_58[1] = '/';
  local_58[2] = 0;
  pcVar12 = "COPYING";
  lVar13 = 0;
  do {
    paVar7 = local_70;
    if ((local_74 == 0) || ((*(uint *)((long)&entries2[0].mode + lVar13) & 0xf000) == 0x4000)) {
      iVar4 = archive_read_next_header(local_70,&local_80);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_mtree.c"
                          ,L'ë',0,"ARCHIVE_OK",(long)iVar4,"archive_read_next_header(a, &ae)",
                          paVar7);
      lVar11 = *(longlong *)((long)&entries2[0].mtime + lVar13);
      tVar8 = archive_entry_mtime(local_80);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_mtree.c"
                          ,L'ì',lVar11,"entries2[i].mtime",tVar8,"archive_entry_mtime(ae)",
                          (void *)0x0);
      uVar1 = *(uint *)((long)&entries2[0].mode + lVar13);
      mVar6 = archive_entry_mode(local_80);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_mtree.c"
                          ,L'í',(ulong)uVar1,"entries2[i].mode",(ulong)mVar6,
                          "archive_entry_mode(ae)",(void *)0x0);
      uVar2 = *(uint *)((long)&entries2[0].uid + lVar13);
      lVar10 = archive_entry_uid(local_80);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_mtree.c"
                          ,L'î',(ulong)uVar2,"entries2[i].uid",lVar10,"archive_entry_uid(ae)",
                          (void *)0x0);
      uVar2 = *(uint *)((long)&entries2[0].gid + lVar13);
      lVar10 = archive_entry_gid(local_80);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_mtree.c"
                          ,L'ï',(ulong)uVar2,"entries2[i].gid",lVar10,"archive_entry_gid(ae)",
                          (void *)0x0);
      strcpy(local_58 + 2,pcVar12);
      pcVar12 = archive_entry_pathname(local_80);
      assertion_equal_string
                ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_mtree.c"
                 ,L'ñ',local_58,"str",pcVar12,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
      if ((uVar1 & 0xf000) != 0x4000) {
        lVar10 = archive_entry_size(local_80);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_mtree.c"
                            ,L'ó',8,"8",lVar10,"archive_entry_size(ae)",(void *)0x0);
      }
    }
    paVar7 = local_70;
    pcVar12 = *(char **)((long)&entries2[1].path + lVar13);
    lVar13 = lVar13 + 0x20;
  } while (lVar13 != 0x160);
  iVar4 = archive_read_close(local_70);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_mtree.c"
                      ,L'õ',0,"ARCHIVE_OK",(long)iVar4,"archive_read_close(a)",paVar7);
  iVar4 = archive_read_free(paVar7);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_mtree.c"
                      ,L'ö',0,"ARCHIVE_OK",(long)iVar4,"archive_read_free(a)",(void *)0x0);
  return;
}

Assistant:

static void
test_write_format_mtree_sub2(int use_set, int dironly)
{
  struct archive_entry *ae;
  struct archive* a;
  size_t used;
  int i;
  char str[32];

  /* Create a mtree format archive. */
  assert((a = archive_write_new()) != NULL);
  assertEqualIntA(a, ARCHIVE_OK, archive_write_set_format_mtree(a));
  if (use_set)
    assertEqualIntA(a, ARCHIVE_OK, archive_write_set_format_option(a, NULL, "use-set", "1"));
  if (dironly)
    assertEqualIntA(a, ARCHIVE_OK, archive_write_set_format_option(a, NULL, "dironly", "1"));
  assertEqualIntA(a, ARCHIVE_OK, archive_write_open_memory(a, buff, sizeof(buff)-1, &used));

  /* Write entries2 */
  for (i = 0; entries2[i].path != NULL; i++) {
    assert((ae = archive_entry_new()) != NULL);
    archive_entry_set_mtime(ae, entries2[i].mtime, 0);
    assert(entries2[i].mtime == archive_entry_mtime(ae));
    archive_entry_set_mode(ae, entries2[i].mode);
    assert(entries2[i].mode == archive_entry_mode(ae));
    archive_entry_set_uid(ae, entries2[i].uid);
    assert(entries2[i].uid == archive_entry_uid(ae));
    archive_entry_set_gid(ae, entries2[i].gid);
    assert(entries2[i].gid == archive_entry_gid(ae));
    archive_entry_copy_pathname(ae, entries2[i].path);
    if ((entries2[i].mode & AE_IFMT) != S_IFDIR)
      archive_entry_set_size(ae, 8);
    assertEqualIntA(a, ARCHIVE_OK, archive_write_header(a, ae));
    if ((entries2[i].mode & AE_IFMT) != S_IFDIR)
      assertEqualIntA(a, 8,
          archive_write_data(a, "Hello012", 15));
    archive_entry_free(ae);
  }
  assertEqualIntA(a, ARCHIVE_OK, archive_write_close(a));
        assertEqualInt(ARCHIVE_OK, archive_write_free(a));

  if (use_set) {
    const char *p;

    buff[used] = '\0';
    assert(NULL != (p = strstr(buff, "\n/set ")));
    if (p != NULL) {
      char *r;
      const char *o;
      p++;
      r = strchr(p, '\n');
      if (r != NULL)
        *r = '\0';
      if (dironly)
        o = "/set type=dir uid=1001 gid=1001 mode=755";
      else
        o = "/set type=file uid=1001 gid=1001 mode=644";
      assertEqualString(o, p);
      if (r != NULL)
        *r = '\n';
    }
  }

  /*
   * Read the data and check it.
   */
  assert((a = archive_read_new()) != NULL);
  assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_all(a));
  assertEqualIntA(a, ARCHIVE_OK, archive_read_support_filter_all(a));
  assertEqualIntA(a, ARCHIVE_OK, archive_read_open_memory(a, buff, used));

  /* Read entries2 */
  memset(str, 0, sizeof(str));
  strcpy(str, "./");
  for (i = 0; entries2[i].path != NULL; i++) {
    if (dironly && (entries2[i].mode & AE_IFMT) != S_IFDIR)
      continue;
    assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
    assertEqualInt(entries2[i].mtime, archive_entry_mtime(ae));
    assertEqualInt(entries2[i].mode, archive_entry_mode(ae));
    assertEqualInt(entries2[i].uid, archive_entry_uid(ae));
    assertEqualInt(entries2[i].gid, archive_entry_gid(ae));
    strcpy(str + 2, entries2[i].path);
    assertEqualString(str, archive_entry_pathname(ae));
    if ((entries2[i].mode & AE_IFMT) != S_IFDIR)
      assertEqualInt(8, archive_entry_size(ae));
  }
  assertEqualIntA(a, ARCHIVE_OK, archive_read_close(a));
  assertEqualInt(ARCHIVE_OK, archive_read_free(a));
}